

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_data.hpp
# Opt level: O0

void __thiscall boost::detail::thread_data_base::thread_data_base(thread_data_base *this)

{
  undefined8 *in_RDI;
  mutex *unaff_retaddr;
  
  enable_shared_from_this<boost::detail::thread_data_base>::enable_shared_from_this
            ((enable_shared_from_this<boost::detail::thread_data_base> *)0x2aa83c);
  *in_RDI = &PTR__thread_data_base_00305548;
  shared_ptr<boost::detail::thread_data_base>::shared_ptr
            ((shared_ptr<boost::detail::thread_data_base> *)0x2aa859);
  in_RDI[5] = 0;
  mutex::mutex(unaff_retaddr);
  condition_variable::condition_variable((condition_variable *)this);
  mutex::mutex(unaff_retaddr);
  condition_variable::condition_variable((condition_variable *)this);
  *(undefined1 *)(in_RDI + 0x26) = 0;
  *(undefined1 *)((long)in_RDI + 0x131) = 0;
  *(undefined1 *)((long)in_RDI + 0x132) = 0;
  in_RDI[0x27] = 0;
  std::
  map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
  ::map((map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
         *)0x2aa8e7);
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  memset(in_RDI + 0x30,0,0x18);
  std::
  vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
  ::vector((vector<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
            *)0x2aa924);
  memset(in_RDI + 0x33,0,0x18);
  std::
  vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
  ::vector((vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
            *)0x2aa94b);
  *(undefined1 *)(in_RDI + 0x36) = 1;
  *(undefined1 *)((long)in_RDI + 0x1b1) = 0;
  return;
}

Assistant:

thread_data_base():
                thread_handle(0),
                done(false),join_started(false),joined(false),
                thread_exit_callbacks(0),
//#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
                cond_mutex(0),
                current_cond(0),
//#endif
                notify(),
                async_states_()
//#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
                , interrupt_enabled(true)
                , interrupt_requested(false)
//#endif
            {}